

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O3

ares_status_t
ares_process_fds_nolock(ares_channel_t *channel,ares_fd_events_t *events,size_t nevents,uint flags)

{
  uint uVar1;
  ares_htable_szvp_t *htable;
  ares_dns_record_t *paVar2;
  ares_dns_record_t *paVar3;
  long lVar4;
  ares_query_t *query;
  char cVar5;
  unsigned_short uVar6;
  ares_status_t aVar7;
  ares_status_t aVar8;
  ares_conn_err_t aVar9;
  ares_bool_t aVar10;
  ares_dns_rcode_t aVar11;
  ares_dns_rec_type_t aVar12;
  ares_conn_t *paVar13;
  size_t sVar14;
  uchar *puVar15;
  ares_query_t *paVar16;
  size_t sVar17;
  ares_dns_rr_t *paVar18;
  ares_dns_rr_t *paVar19;
  ares_slist_node_t *paVar20;
  ares_server_t *paVar21;
  ares_buf_t *buf;
  size_t sVar22;
  ares_channel_t *paVar23;
  char *aname;
  ares_array_t *requeue;
  ares_timeval_t now;
  size_t count;
  ares_dns_class_t qclass;
  ares_dns_rec_type_t atype;
  ares_dns_rec_type_t qtype;
  unsigned_short local_c2;
  ares_dns_record_t *local_c0;
  ares_channel_t *local_b8;
  char *local_b0;
  ares_query_t *local_a8;
  size_t local_a0;
  ares_array_t *local_98;
  ares_timeval_t local_90;
  char *local_80;
  ares_server_t *local_78;
  ares_server_t *local_70;
  ares_channel_t *local_68;
  size_t local_60;
  uint local_54;
  ares_dns_class_t local_50;
  ares_dns_class_t local_4c;
  ares_dns_rec_type_t local_48;
  ares_dns_rec_type_t local_44;
  ares_channel_t *local_40;
  ares_dns_record_t *local_38;
  
  if (events == (ares_fd_events_t *)0x0 && nevents != 0) {
    return ARES_EFORMERR;
  }
  local_a0 = nevents;
  local_68 = channel;
  ares_tvnow(&local_90);
  if (local_a0 == 0) {
    if ((flags & 1) != 0) {
      return ARES_SUCCESS;
    }
  }
  else {
    aVar8 = ARES_SUCCESS;
    sVar22 = 0;
    sVar14 = local_a0;
    local_54 = flags;
    do {
      if ((events[sVar22].fd != -1) && ((events[sVar22].events & 2) != 0)) {
        paVar13 = ares_conn_from_fd(local_68,events[sVar22].fd);
        aVar8 = ARES_SUCCESS;
        sVar14 = local_a0;
        if (paVar13 != (ares_conn_t *)0x0) {
          if ((paVar13->flags & ARES_CONN_FLAG_TFO_INITIAL) == ARES_CONN_FLAG_NONE) {
            *(undefined1 *)&paVar13->state_flags =
                 (char)paVar13->state_flags | ARES_CONN_STATE_CONNECTED;
          }
          aVar7 = ares_conn_flush(paVar13);
          sVar14 = local_a0;
          if (aVar7 != ARES_SUCCESS) {
            server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
            ares_close_connection(paVar13,aVar7);
            sVar14 = local_a0;
            aVar8 = aVar7;
            if (aVar7 == ARES_ENOMEM) {
              return ARES_ENOMEM;
            }
          }
        }
      }
      sVar22 = sVar22 + 1;
    } while (sVar14 != sVar22);
    sVar22 = 0;
    do {
      if ((events[sVar22].fd != -1) && ((events[sVar22].events & 1) != 0)) {
        paVar13 = ares_conn_from_fd(local_68,events[sVar22].fd);
        if (paVar13 == (ares_conn_t *)0x0) {
          aVar8 = ARES_SUCCESS;
          sVar14 = local_a0;
        }
        else {
          paVar23 = paVar13->server->channel;
          do {
            while( true ) {
              local_b0 = (char *)0xffff;
              sVar14 = ares_buf_len(paVar13->in_buf);
              if ((((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) &&
                  (aVar8 = ares_buf_append_be16(paVar13->in_buf,0), aVar8 != ARES_SUCCESS)) ||
                 (puVar15 = ares_buf_append_start(paVar13->in_buf,(size_t *)&local_b0),
                 puVar15 == (uchar *)0x0)) {
                ares_close_connection(paVar13,ARES_SUCCESS);
                return ARES_ENOMEM;
              }
              aVar9 = ares_conn_read(paVar13,puVar15,(size_t)local_b0,(size_t *)&local_80);
              if (aVar9 != ARES_CONN_ERR_SUCCESS) {
                ares_buf_append_finish(paVar13->in_buf,0);
                if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                  ares_buf_set_length(paVar13->in_buf,sVar14);
                }
                if (aVar9 != ARES_CONN_ERR_WOULDBLOCK) {
                  server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
                  aVar8 = ARES_ECONNREFUSED;
                  ares_close_connection(paVar13,ARES_ECONNREFUSED);
                  sVar14 = local_a0;
                  goto LAB_00113a6c;
                }
                goto LAB_00113507;
              }
              ares_buf_append_finish(paVar13->in_buf,(size_t)local_80);
              uVar1 = (paVar23->sock_funcs).flags;
              if ((uVar1 & 1) != 0) break;
              if ((paVar13->flags & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE) goto LAB_00113507;
LAB_00113483:
              local_b0 = (char *)ares_buf_len(paVar13->in_buf);
              ares_buf_set_length(paVar13->in_buf,sVar14);
              ares_buf_append_be16(paVar13->in_buf,(unsigned_short)local_80);
              ares_buf_set_length(paVar13->in_buf,(size_t)local_b0);
              if ((uVar1 & 1) == 0) goto LAB_00113507;
            }
            if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) goto LAB_00113483;
          } while (local_80 == local_b0);
LAB_00113507:
          local_b8 = paVar13->server->channel;
          local_98 = (ares_array_t *)0x0;
          while( true ) {
            local_60 = 0;
            local_c2 = 0;
            ares_buf_tag(paVar13->in_buf);
            aVar8 = ares_buf_fetch_be16(paVar13->in_buf,&local_c2);
            if (aVar8 != ARES_SUCCESS) break;
            aVar8 = ares_buf_consume(paVar13->in_buf,(ulong)local_c2);
            buf = paVar13->in_buf;
            if (aVar8 != ARES_SUCCESS) goto LAB_001139ec;
            puVar15 = ares_buf_tag_fetch(buf,&local_60);
            if ((puVar15 == (uchar *)0x0) || (local_60 < 2)) {
              ares_buf_tag_clear(paVar13->in_buf);
              aVar8 = ARES_SUCCESS;
              paVar23 = local_b8;
              goto LAB_001139fb;
            }
            local_60 = local_60 - 2;
            local_70 = paVar13->server;
            local_c0 = (ares_dns_record_t *)0x0;
            if (local_60 != 0) {
              aVar8 = ares_dns_parse(puVar15 + 2,local_60,0,&local_c0);
              if (aVar8 != ARES_SUCCESS) {
                aVar8 = ARES_EBADRESP;
                paVar23 = local_b8;
LAB_00113ac8:
                ares_dns_record_destroy(local_c0);
LAB_00113ad7:
                server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
                ares_close_connection(paVar13,aVar8);
                goto LAB_001139fb;
              }
              htable = local_b8->queries_by_qid;
              uVar6 = ares_dns_record_get_id(local_c0);
              paVar16 = (ares_query_t *)ares_htable_szvp_get_direct(htable,(ulong)uVar6);
              paVar3 = local_c0;
              if (paVar16 != (ares_query_t *)0x0) {
                local_40 = paVar16->channel;
                paVar2 = paVar16->query;
                sVar14 = ares_dns_record_query_cnt(paVar2);
                local_38 = paVar3;
                local_a8 = paVar16;
                sVar17 = ares_dns_record_query_cnt(paVar3);
                if (sVar14 == sVar17) {
                  sVar14 = ares_dns_record_query_cnt(paVar2);
                  if (sVar14 != 0) {
                    sVar14 = 0;
                    do {
                      local_80 = (char *)0x0;
                      local_b0 = (char *)0x0;
                      aVar8 = ares_dns_record_query_get(paVar2,sVar14,&local_80,&local_44,&local_4c)
                      ;
                      if (((aVar8 != ARES_SUCCESS) || (local_80 == (char *)0x0)) ||
                         ((aVar8 = ares_dns_record_query_get
                                             (local_38,sVar14,&local_b0,&local_48,&local_50),
                          aVar8 != ARES_SUCCESS ||
                          (((local_b0 == (char *)0x0 || (local_44 != local_48)) ||
                           (local_4c != local_50)))))) goto LAB_0011373b;
                      if (((local_40->flags & 0x400) == 0) || (local_a8->using_tcp != ARES_FALSE)) {
                        aVar10 = ares_strcaseeq(local_80,local_b0);
                      }
                      else {
                        aVar10 = ares_streq(local_80,local_b0);
                      }
                      if (aVar10 == ARES_FALSE) goto LAB_0011373b;
                      sVar14 = sVar14 + 1;
                      sVar17 = ares_dns_record_query_cnt(paVar2);
                    } while (sVar14 < sVar17);
                  }
                  paVar16 = local_a8;
                  aVar8 = ares_cookie_validate(local_a8,local_c0,paVar13,&local_90,&local_98);
                  if (aVar8 == ARES_SUCCESS) {
                    ares_llist_node_destroy(paVar16->node_queries_to_conn);
                    paVar2 = local_c0;
                    paVar16->node_queries_to_conn = (ares_llist_node_t *)0x0;
                    paVar3 = paVar16->query;
                    aVar11 = ares_dns_record_get_rcode(local_c0);
                    if (((aVar11 == ARES_RCODE_FORMERR) &&
                        (paVar18 = ares_dns_get_opt_rr_const(paVar3),
                        paVar18 != (ares_dns_rr_t *)0x0)) &&
                       ((paVar19 = ares_dns_get_opt_rr_const(paVar2),
                        paVar19 == (ares_dns_rr_t *)0x0 ||
                        ((sVar14 = ares_dns_rr_get_opt_cnt(paVar18,ARES_RR_OPT_OPTIONS), sVar14 != 0
                         && (paVar18 = ares_dns_get_opt_rr_const(paVar2),
                            paVar18 != (ares_dns_rr_t *)0x0)))))) {
                      paVar16 = local_a8;
                      sVar14 = ares_dns_record_rr_cnt(local_a8->query,ARES_SECTION_ADDITIONAL);
                      if (sVar14 == 0) {
LAB_00113af6:
                        paVar23 = local_b8;
                        aVar8 = ARES_EFORMERR;
                        end_query(local_b8,local_70,paVar16,ARES_EFORMERR,(ares_dns_record_t *)0x0);
                        goto LAB_00113ac8;
                      }
                      sVar14 = 0;
                      while( true ) {
                        paVar18 = ares_dns_record_rr_get
                                            (paVar16->query,ARES_SECTION_ADDITIONAL,sVar14);
                        aVar12 = ares_dns_rr_get_type(paVar18);
                        if (aVar12 == ARES_REC_TYPE_OPT) break;
                        sVar14 = sVar14 + 1;
                        sVar17 = ares_dns_record_rr_cnt(paVar16->query,ARES_SECTION_ADDITIONAL);
                        if (sVar17 <= sVar14) goto LAB_00113af6;
                      }
                      ares_dns_record_rr_del(paVar16->query,ARES_SECTION_ADDITIONAL,sVar14);
                      paVar21 = local_70;
LAB_0011396c:
                      aVar8 = ares_append_requeue(&local_98,paVar16,paVar21);
                      ares_dns_record_destroy(local_c0);
                      paVar23 = local_b8;
                      if (aVar8 == ARES_SUCCESS) goto LAB_00113745;
                      goto LAB_00113ad7;
                    }
                    uVar6 = ares_dns_record_get_flags(local_c0);
                    paVar21 = local_70;
                    paVar16 = local_a8;
                    if ((uVar6 & 4) == 0) {
                      cVar5 = (char)local_b8->flags;
                    }
                    else {
                      cVar5 = (char)local_b8->flags;
                      if ((local_b8->flags & 4) == 0 &&
                          (paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                        local_a8->using_tcp = ARES_TRUE;
                        paVar21 = (ares_server_t *)0x0;
                        goto LAB_0011396c;
                      }
                    }
                    if (cVar5 < '\0') {
LAB_001138a8:
                      aVar8 = ares_qcache_insert(local_b8,&local_90,paVar16,local_c0);
                      aVar10 = paVar16->using_tcp;
                      paVar20 = ares_slist_node_find(paVar21->channel->servers,paVar21);
                      if (paVar20 != (ares_slist_node_t *)0x0) {
                        if (paVar21->consec_failures != 0) {
                          paVar21->consec_failures = 0;
                          ares_slist_node_reinsert(paVar20);
                        }
                        (paVar21->next_retry_time).sec = 0;
                        (paVar21->next_retry_time).usec = 0;
                        invoke_server_state_cb(paVar21,ARES_TRUE,(aVar10 == ARES_TRUE) + 1);
                      }
                      end_query(local_b8,paVar21,local_a8,ARES_SUCCESS,local_c0);
                      if (aVar8 == ARES_SUCCESS) goto LAB_00113745;
                    }
                    else {
                      aVar11 = ares_dns_record_get_rcode(local_c0);
                      query = local_a8;
                      if (aVar11 == ARES_RCODE_SERVFAIL) {
                        aVar8 = ARES_ESERVFAIL;
                      }
                      else if (aVar11 == ARES_RCODE_REFUSED) {
                        aVar8 = ARES_EREFUSED;
                      }
                      else {
                        if (aVar11 != ARES_RCODE_NOTIMP) goto LAB_001138a8;
                        aVar8 = ARES_ENOTIMP;
                      }
                      server_increment_failures(paVar21,local_a8->using_tcp);
                      aVar8 = ares_requeue_query(query,&local_90,aVar8,ARES_TRUE,local_c0,&local_98)
                      ;
                      if (aVar8 == ARES_ENOMEM) {
                        aVar8 = ARES_ENOMEM;
                        paVar23 = local_b8;
                        goto LAB_00113ac8;
                      }
                    }
                  }
                }
              }
LAB_0011373b:
              ares_dns_record_destroy(local_c0);
            }
LAB_00113745:
            ares_buf_tag_clear(paVar13->in_buf);
          }
          buf = paVar13->in_buf;
LAB_001139ec:
          ares_buf_tag_rollback(buf);
          paVar23 = local_b8;
LAB_001139fb:
          while( true ) {
            sVar14 = ares_array_len(local_98);
            if ((sVar14 == 0) ||
               (aVar7 = ares_array_claim_at(&local_80,0x10,local_98,0), aVar7 != ARES_SUCCESS))
            break;
            paVar16 = (ares_query_t *)
                      ares_htable_szvp_get_direct(paVar23->queries_by_qid,(ulong)local_80 & 0xffff);
            if ((paVar16 != (ares_query_t *)0x0) &&
               (aVar7 = ares_send_query(local_78,paVar16,&local_90), aVar7 == ARES_ENOMEM)) {
              aVar8 = ARES_ENOMEM;
            }
          }
          ares_array_destroy(local_98);
          sVar14 = local_a0;
          if (aVar8 == ARES_ENOMEM) {
            return ARES_ENOMEM;
          }
        }
      }
LAB_00113a6c:
      sVar22 = sVar22 + 1;
    } while (sVar22 != sVar14);
    if ((local_54 & 1) != 0) {
      if (aVar8 == ARES_ENOMEM) {
        return ARES_ENOMEM;
      }
      return ARES_SUCCESS;
    }
  }
  paVar23 = local_68;
  ares_check_cleanup_conns(local_68);
  paVar20 = ares_slist_node_first(paVar23->queries_by_timeout);
  if (paVar20 == (ares_slist_node_t *)0x0) {
    return ARES_SUCCESS;
  }
  do {
    paVar16 = (ares_query_t *)ares_slist_node_val(paVar20);
    lVar4 = (paVar16->timeout).sec;
    if (local_90.sec <= lVar4) {
      if (local_90.sec - lVar4 < 0) {
        return ARES_SUCCESS;
      }
      if (local_90.usec < (paVar16->timeout).usec) {
        return ARES_SUCCESS;
      }
    }
    paVar16->timeouts = paVar16->timeouts + 1;
    server_increment_failures(paVar16->conn->server,paVar16->using_tcp);
    aVar8 = ares_requeue_query(paVar16,&local_90,ARES_ETIMEOUT,ARES_TRUE,(ares_dns_record_t *)0x0,
                               (ares_array_t **)0x0);
    if (aVar8 == ARES_ENOMEM) {
      return ARES_ENOMEM;
    }
    paVar20 = ares_slist_node_first(local_68->queries_by_timeout);
  } while (paVar20 != (ares_slist_node_t *)0x0);
  return ARES_SUCCESS;
}

Assistant:

static ares_status_t ares_process_fds_nolock(ares_channel_t         *channel,
                                             const ares_fd_events_t *events,
                                             size_t nevents, unsigned int flags)
{
  ares_timeval_t now;
  size_t         i;
  ares_status_t  status = ARES_SUCCESS;

  if (channel == NULL || (events == NULL && nevents != 0)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_tvnow(&now);

  /* Process write events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_WRITE)) {
      continue;
    }
    status = process_write(channel, events[i].fd);
    /* We only care about ENOMEM, anything else is handled via connection
     * retries, etc */
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  /* Process read events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_READ)) {
      continue;
    }
    status = process_read(channel, events[i].fd, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  if (!(flags & ARES_PROCESS_FLAG_SKIP_NON_FD)) {
    ares_check_cleanup_conns(channel);
    status = process_timeouts(channel, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

done:
  if (status == ARES_ENOMEM) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}